

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Response.cpp
# Opt level: O3

void __thiscall Response::Status::Status(Status *this,int code)

{
  char *pcVar1;
  
  (this->status)._M_dataplus._M_p = (pointer)&(this->status).field_2;
  (this->status)._M_string_length = 0;
  (this->status).field_2._M_local_buf[0] = '\0';
  this->code = code;
  if (code < 0x194) {
    if (code == 200) {
      pcVar1 = "OK";
    }
    else {
      if (code != 0x193) {
        return;
      }
      pcVar1 = "FORBIDDEN";
    }
  }
  else if (code == 0x194) {
    pcVar1 = "NOT FOUND";
  }
  else {
    if (code != 0x195) {
      return;
    }
    pcVar1 = "METHOD NOT ALLOWED";
  }
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,(ulong)pcVar1);
  return;
}

Assistant:

Response::Status::Status(int code) : code(code) {
    switch (code) {
    case 200:
        status = "OK";
        break;
    case 403:
        status = "FORBIDDEN";
        break;
    case 404:
        status = "NOT FOUND";
        break;
    case 405:
        status = "METHOD NOT ALLOWED";
        break;
    }
}